

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# machine_implementation.cc
# Opt level: O2

bool testbench::machine::availability::is(char *name)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 *puVar4;
  
  anon_unknown_0::factory_init();
  puVar1 = (undefined8 *)(anonymous_namespace)::machines[1];
  puVar2 = (undefined8 *)*(anonymous_namespace)::machines;
  do {
    puVar4 = puVar2;
    if (puVar4 == puVar1) break;
    iVar3 = strcmp((char *)*puVar4,name);
    puVar2 = puVar4 + 1;
  } while (iVar3 != 0);
  return puVar4 != puVar1;
}

Assistant:

bool machine::availability::is(const char *name)
{
    factory_init();
    for (auto current_name : machines->names) {
        if (strcmp(current_name, name) == 0) {
            return true;
        }
    }
    return false;
}